

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipAnalysis.cpp
# Opt level: O2

HighsInt __thiscall HighsMipAnalysis::mipTimerNumCall(HighsMipAnalysis *this,HighsInt mip_clock)

{
  HighsInt HVar1;
  
  HVar1 = 0;
  if (this->analyse_mip_time == true) {
    HVar1 = (((this->mip_clocks).timer_pointer_)->clock_num_call).
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [(this->mip_clocks).clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[mip_clock]];
  }
  return HVar1;
}

Assistant:

HighsInt HighsMipAnalysis::mipTimerNumCall(const HighsInt mip_clock
                                           // , const HighsInt thread_id
) const {
  if (!analyse_mip_time) return 0;
  HighsInt highs_timer_clock = mip_clocks.clock_[mip_clock];
  return mip_clocks.timer_pointer_->numCall(highs_timer_clock);
}